

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.hpp
# Opt level: O2

void __thiscall
gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
~BlockingQueue(BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this)

{
  std::mutex::lock(&this->m_pullLock);
  std::mutex::lock(&this->m_pushLock);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
            (&this->pushElements);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
            (&this->pullElements);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_pullLock);
  std::condition_variable::~condition_variable(&this->condition);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::~vector
            (&this->pullElements);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::~vector
            (&this->pushElements);
  return;
}

Assistant:

~BlockingQueue()
        {
            // these locks are primarily for memory synchronization multiple
            // access in the destructor would be a bad thing
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            std::lock_guard<MUTEX> pushLock(m_pushLock);  // second pushLock
            pushElements.clear();
            pullElements.clear();
        }